

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O1

int lyb_parse_subtree(char *data,lyd_node *parent,lyd_node **first_sibling,char *yang_data_name,
                     int options,unres_data *unres,lyb_state *lybs)

{
  lyd_node *plVar1;
  size_t sVar2;
  long lVar3;
  lyd_attr *plVar4;
  lys_ext_instance_complex *plVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  lyd_attr *plVar11;
  char *pcVar12;
  undefined8 *puVar13;
  lyd_node **pplVar14;
  lyd_node *plVar15;
  byte bVar16;
  lys_module *plVar18;
  lys_node *plVar19;
  size_t __nmemb;
  char *pcVar20;
  lyd_node_leaf_list *plVar21;
  lys_module *plVar22;
  int iVar23;
  ulong uVar24;
  lys_module *local_b8;
  lyd_node **local_b0;
  char *local_a8;
  undefined8 local_a0;
  lys_module *local_98;
  lys_module *mod;
  lys_node *snode;
  lyd_attr *local_80;
  lys_module *local_78;
  uint local_6c;
  int local_68;
  uint local_64;
  lys_ext_instance_complex *local_60;
  lyd_node *local_58;
  lyd_node_leaf_list *local_50;
  uint local_44;
  lys_ext_instance_complex *local_40;
  byte local_31 [8];
  uint8_t count;
  undefined8 uVar17;
  
  local_b0 = first_sibling;
  local_58 = parent;
  local_44 = options;
  if ((parent == (lyd_node *)0x0) != (first_sibling != (lyd_node **)0x0)) {
    __assert_fail("(parent && !first_sibling) || (!parent && first_sibling)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                  ,0x3f8,
                  "int lyb_parse_subtree(const char *, struct lyd_node *, struct lyd_node **, const char *, int, struct unres_data *, struct lyb_state *)"
                 );
  }
  uVar6 = lyb_read_start_subtree(data,lybs);
  plVar15 = local_58;
  if (-1 < (int)uVar6) {
    pcVar20 = data + uVar6;
    if (local_58 == (lyd_node *)0x0) {
      uVar7 = lyb_parse_model(pcVar20,&local_98,lybs);
      if ((int)uVar7 < 0) goto LAB_001447c1;
      uVar6 = uVar6 + uVar7;
      pcVar20 = pcVar20 + uVar7;
      if (local_98 != (lys_module *)0x0) {
        plVar19 = (lys_node *)0x0;
        plVar18 = local_98;
        goto LAB_001441c3;
      }
    }
    else {
      local_98 = lyd_node_module(local_58);
      plVar19 = plVar15->schema;
      yang_data_name = (char *)0x0;
      plVar18 = (lys_module *)0x0;
LAB_001441c3:
      uVar7 = lyb_parse_schema_hash
                        (plVar19,plVar18,pcVar20,yang_data_name,local_44,(lys_node **)&mod,lybs);
    }
    plVar18 = mod;
    if (-1 < (int)uVar7) {
      iVar23 = uVar6 + uVar7;
      pcVar20 = pcVar20 + uVar7;
      if (local_98 == (lys_module *)0x0 || mod == (lys_module *)0x0) {
        iVar10 = lyb_skip_subtree(pcVar20,lybs);
        if (-1 < iVar10) {
          iVar23 = iVar23 + iVar10;
          goto LAB_001442a3;
        }
      }
      else {
        iVar10 = *(int *)&mod->filepath;
        plVar21 = (lyd_node_leaf_list *)0x0;
        snode = (lys_node *)unres;
        if (iVar10 < 0x20) {
          if (7 < iVar10) {
            if (iVar10 != 8) {
              plVar21 = (lyd_node_leaf_list *)0x0;
              if (iVar10 != 0x10) goto LAB_00144388;
              goto LAB_001442eb;
            }
LAB_001442f5:
            plVar21 = (lyd_node_leaf_list *)calloc(0x50,1);
            if (*(int *)&plVar18->features == 9) {
              plVar21->validity = plVar21->validity | 8;
            }
            goto LAB_00144331;
          }
          if (iVar10 == 1) goto LAB_001442eb;
          if (iVar10 == 4) goto LAB_001442f5;
        }
        else {
          if (iVar10 < 0x100) {
            if (iVar10 != 0x20) {
              if (iVar10 != 0x80) goto LAB_00144388;
              goto LAB_001442eb;
            }
LAB_0014431c:
            __nmemb = 0x40;
          }
          else {
            if (iVar10 != 0x100) {
              if (iVar10 == 0x8020) goto LAB_0014431c;
              if (iVar10 != 0x4000) goto LAB_00144388;
            }
LAB_001442eb:
            __nmemb = 0x48;
          }
          plVar21 = (lyd_node_leaf_list *)calloc(__nmemb,1);
LAB_00144331:
          if (plVar21 == (lyd_node_leaf_list *)0x0) {
            plVar21 = (lyd_node_leaf_list *)0x0;
            ly_log(*(ly_ctx **)plVar18->contact,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lyb_new_node");
          }
          else {
            plVar21->schema = (lys_node *)plVar18;
            iVar10 = resolve_applies_when((lys_node *)plVar18,0,(lys_node *)0x0);
            if (iVar10 != 0) {
              plVar21->field_0x9 = plVar21->field_0x9 & 0xf1 | 0xc;
            }
            plVar21->prev = (lyd_node *)plVar21;
          }
        }
LAB_00144388:
        if (plVar21 != (lyd_node_leaf_list *)0x0) {
          local_31[0] = 0;
          local_a8 = pcVar20;
          local_50 = plVar21;
          uVar6 = lyb_read(pcVar20,local_31,1,lybs);
          if ((int)uVar6 < 0) {
LAB_0014481f:
            lyd_free_attr(lybs->ctx,(lyd_node *)local_50,local_50->attr,1);
            uVar6 = 0xffffffff;
          }
          else if (local_31[0] != 0) {
            pcVar20 = local_a8 + uVar6;
            local_80 = (lyd_attr *)0x0;
            uVar17 = 0;
            do {
              local_a0 = uVar17;
              uVar7 = lyb_read_start_subtree(pcVar20,lybs);
              if ((int)uVar7 < 0) goto LAB_0014481f;
              uVar8 = lyb_parse_model(pcVar20 + uVar7,&local_b8,lybs);
              if ((int)uVar8 < 0) goto LAB_0014481f;
              uVar6 = uVar6 + uVar7 + uVar8;
              pcVar20 = pcVar20 + uVar7 + uVar8;
              if (local_b8 != (lys_module *)0x0) {
                local_78 = local_b8;
                local_60 = (lys_ext_instance_complex *)0x0;
                uVar7 = lyb_read_string(pcVar20,(char **)&local_60,1,lybs);
                plVar18 = local_78;
                if ((int)uVar7 < 0) {
                  uVar7 = 0xffffffff;
                }
                else {
                  bVar16 = local_78->ext_size;
                  uVar8 = 0xffffffff;
                  local_6c = uVar7;
                  if (bVar16 != 0) {
                    iVar10 = 0;
                    local_40 = local_60;
                    do {
                      iVar9 = lys_ext_instance_presence
                                        ((*(plVar18->ctx->models).list)->extensions,
                                         plVar18->ext + iVar10,bVar16 - (char)iVar10);
                      if (iVar9 == -1) break;
                      uVar8 = iVar9 + iVar10;
                      iVar10 = ly_strequal_(plVar18->ext[(int)uVar8]->arg_value,(char *)local_40);
                      if (iVar10 != 0) goto LAB_0014450d;
                      iVar10 = uVar8 + 1;
                      bVar16 = plVar18->ext_size;
                    } while (iVar10 < (int)(uint)bVar16);
                    uVar8 = 0xffffffff;
                  }
LAB_0014450d:
                  plVar5 = local_60;
                  local_68 = iVar23;
                  local_64 = uVar6;
                  if (uVar8 == 0xffffffff) {
                    if (plVar18->inc_size == '\0') {
                      local_40 = (lys_ext_instance_complex *)0xffffffff;
                      goto LAB_0014451f;
                    }
                    local_40 = (lys_ext_instance_complex *)CONCAT44(local_40._4_4_,0xffffffff);
                    uVar24 = 0;
                    do {
                      plVar22 = (lys_module *)plVar18->inc[uVar24].submodule;
                      bVar16 = plVar22->ext_size;
                      if (bVar16 != 0) {
                        iVar23 = 0;
                        do {
                          iVar10 = lys_ext_instance_presence
                                             ((*(plVar18->ctx->models).list)->extensions,
                                              plVar22->ext + iVar23,bVar16 - (char)iVar23);
                          plVar18 = local_78;
                          if (iVar10 == -1) break;
                          iVar10 = iVar10 + iVar23;
                          iVar23 = ly_strequal_(plVar22->ext[iVar10]->arg_value,(char *)plVar5);
                          plVar18 = local_78;
                          if (iVar23 != 0) {
                            local_40 = (lys_ext_instance_complex *)CONCAT44(local_40._4_4_,iVar10);
                            break;
                          }
                          iVar23 = iVar10 + 1;
                          bVar16 = plVar22->ext_size;
                        } while (iVar23 < (int)(uint)bVar16);
                      }
                      uVar24 = uVar24 + 1;
                    } while (uVar24 < plVar18->inc_size);
                  }
                  else {
                    local_40 = (lys_ext_instance_complex *)(ulong)uVar8;
LAB_0014451f:
                    plVar22 = (lys_module *)0x0;
                  }
                  plVar5 = local_60;
                  uVar6 = local_64;
                  iVar23 = local_68;
                  if ((int)local_40 == -1) {
                    local_40 = (lys_ext_instance_complex *)0x0;
                  }
                  else {
                    if (plVar22 == (lys_module *)0x0) {
                      plVar22 = plVar18;
                    }
                    local_40 = (lys_ext_instance_complex *)plVar22->ext[(int)local_40];
                  }
                  if (((local_44 >> 9 & 1) != 0) && (local_40 == (lys_ext_instance_complex *)0x0)) {
                    local_6c = 0xffffffff;
                    ly_vlog(plVar18->ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                            "Failed to find annotation \"%s\" in \"%s\".",local_60,plVar18->name);
                  }
                  free(plVar5);
                  uVar7 = local_6c;
                }
                if ((int)uVar7 < 0) goto LAB_0014481f;
                uVar6 = uVar6 + uVar7;
                pcVar20 = pcVar20 + uVar7;
              }
              plVar21 = local_50;
              plVar4 = local_80;
              if ((local_b8 != (lys_module *)0x0) && (local_40 != (lys_ext_instance_complex *)0x0))
              {
                if (local_80 == (lyd_attr *)0x0) {
                  if (local_50->attr != (lyd_attr *)0x0) {
                    __assert_fail("!node->attr",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                                  ,0x348,
                                  "int lyb_parse_attributes(struct lyd_node *, const char *, int, struct unres_data *, struct lyb_state *)"
                                 );
                  }
                  plVar11 = (lyd_attr *)calloc(1,0x38);
                  if (plVar11 != (lyd_attr *)0x0) {
                    plVar21->attr = plVar11;
                    goto LAB_00144725;
                  }
                }
                else {
                  plVar11 = (lyd_attr *)calloc(1,0x38);
                  plVar4->next = plVar11;
                  if (plVar11 != (lyd_attr *)0x0) {
LAB_00144725:
                    plVar11->annotation = local_40;
                    pcVar12 = lydict_insert(lybs->ctx,local_40->arg_value,0);
                    plVar11->name = pcVar12;
                    local_80 = plVar11;
                    puVar13 = (undefined8 *)
                              lys_ext_complex_get_substmt
                                        (LY_STMT_TYPE,plVar11->annotation,(lyext_substmt **)0x0);
                    if (((puVar13 != (undefined8 *)0x0) && ((lys_type *)*puVar13 != (lys_type *)0x0)
                        ) && (uVar7 = lyb_parse_value((lys_type *)*puVar13,(lyd_node_leaf_list *)0x0
                                                      ,local_80,pcVar20,(unres_data *)snode,lybs),
                             -1 < (int)uVar7)) {
                      uVar6 = uVar6 + uVar7;
                      pcVar20 = pcVar20 + uVar7;
                      goto LAB_00144793;
                    }
                    goto LAB_0014481f;
                  }
                }
                ly_log(lybs->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                       "lyb_parse_attributes");
                goto LAB_0014481f;
              }
              do {
                uVar7 = lyb_read(pcVar20,(uint8_t *)0x0,lybs->written[(long)lybs->used + -1],lybs);
                if ((int)uVar7 < 0) goto LAB_0014481f;
                uVar6 = uVar6 + uVar7;
                pcVar20 = pcVar20 + uVar7;
              } while (lybs->written[(long)lybs->used + -1] != 0);
LAB_00144793:
              uVar17 = local_a0;
              lyb_read_stop_subtree(lybs);
              bVar16 = (char)uVar17 + 1;
              uVar17 = CONCAT71((int7)((ulong)uVar17 >> 8),bVar16);
            } while (bVar16 < local_31[0]);
          }
          plVar21 = local_50;
          plVar19 = snode;
          if ((int)uVar6 < 0) goto LAB_001447c4;
          iVar23 = iVar23 + uVar6;
          pcVar20 = local_a8 + uVar6;
          iVar10 = *(int *)&mod->filepath;
          if (iVar10 < 0x20) {
            if (iVar10 < 8) {
              if (iVar10 != 1) {
                if (iVar10 != 4) goto LAB_001447c4;
LAB_001448dd:
                uVar6 = lyb_parse_value((lys_type *)&local_50->schema[1].ref,local_50,
                                        (lyd_attr *)0x0,pcVar20,(unres_data *)snode,lybs);
                goto LAB_0014490e;
              }
            }
            else {
              if (iVar10 == 8) goto LAB_001448dd;
              if (iVar10 != 0x10) goto LAB_001447c4;
            }
          }
          else if (iVar10 < 0x100) {
            if (iVar10 == 0x20) goto LAB_001448fd;
            if (iVar10 != 0x80) goto LAB_001447c4;
          }
          else if ((iVar10 != 0x100) && (iVar10 != 0x4000)) {
            if (iVar10 != 0x8020) goto LAB_001447c4;
LAB_001448fd:
            uVar6 = lyb_parse_anydata((lyd_node *)local_50,pcVar20,lybs);
LAB_0014490e:
            if ((int)uVar6 < 0) goto LAB_001447c4;
            iVar23 = iVar23 + uVar6;
            pcVar20 = pcVar20 + uVar6;
          }
          if (local_58 == (lyd_node *)0x0) {
            if (*local_b0 == (lyd_node *)0x0) {
              *local_b0 = (lyd_node *)plVar21;
            }
            else {
              (*local_b0)->prev->next = (lyd_node *)plVar21;
              plVar21->prev = (*local_b0)->prev;
              (*local_b0)->prev = (lyd_node *)plVar21;
            }
          }
          else {
            plVar15 = local_58->child;
            if (plVar15 == (lyd_node *)0x0) {
              pplVar14 = &local_58->child;
            }
            else {
              plVar1 = plVar15->prev;
              pplVar14 = &plVar15->prev;
              plVar1->next = (lyd_node *)plVar21;
              plVar21->prev = plVar1;
            }
            *pplVar14 = (lyd_node *)plVar21;
            plVar21->parent = local_58;
          }
          sVar2 = lybs->written[(long)lybs->used + -1];
          while (sVar2 != 0) {
            uVar6 = lyb_parse_subtree(pcVar20,(lyd_node *)plVar21,(lyd_node **)0x0,(char *)0x0,
                                      local_44,(unres_data *)plVar19,lybs);
            if ((int)uVar6 < 0) goto LAB_001447c4;
            iVar23 = iVar23 + uVar6;
            pcVar20 = pcVar20 + uVar6;
            sVar2 = lybs->written[(long)lybs->used + -1];
          }
          plVar19 = plVar21->schema;
          if ((plVar19->nodetype == LYS_CONTAINER) &&
             (lVar3._0_2_ = plVar19[1].flags, lVar3._2_1_ = plVar19[1].ext_size,
             lVar3._3_1_ = plVar19[1].iffeature_size, lVar3._4_1_ = plVar19[1].padding[0],
             lVar3._5_1_ = plVar19[1].padding[1], lVar3._6_1_ = plVar19[1].padding[2],
             lVar3._7_1_ = plVar19[1].padding[3], lVar3 == 0)) {
            for (plVar15 = (plVar21->value).instance; plVar15 != (lyd_node *)0x0;
                plVar15 = plVar15->next) {
              if ((plVar15->field_0x9 & 1) == 0) goto LAB_00144a07;
            }
            plVar21->field_0x9 = plVar21->field_0x9 | 1;
          }
LAB_00144a07:
          if ((plVar21->schema->nodetype != LYS_LIST) || (plVar21->schema->padding[2] == '\0')) {
            lyd_hash((lyd_node *)plVar21);
            lyd_insert_hash((lyd_node *)plVar21);
          }
LAB_001442a3:
          lyb_read_stop_subtree(lybs);
          return iVar23;
        }
      }
    }
  }
LAB_001447c1:
  plVar21 = (lyd_node_leaf_list *)0x0;
LAB_001447c4:
  lyd_free((lyd_node *)plVar21);
  if ((local_b0 != (lyd_node **)0x0) && ((lyd_node_leaf_list *)*local_b0 == plVar21)) {
    *local_b0 = (lyd_node *)0x0;
  }
  return -1;
}

Assistant:

static int
lyb_parse_subtree(const char *data, struct lyd_node *parent, struct lyd_node **first_sibling, const char *yang_data_name,
        int options, struct unres_data *unres, struct lyb_state *lybs)
{
    int r, ret = 0;
    struct lyd_node *node = NULL, *iter;
    const struct lys_module *mod;
    struct lys_node *snode;

    assert((parent && !first_sibling) || (!parent && first_sibling));

    /* register a new subtree */
    ret += (r = lyb_read_start_subtree(data, lybs));
    LYB_HAVE_READ_GOTO(r, data, error);

    if (!parent) {
        /* top-level, read module name */
        ret += (r = lyb_parse_model(data, &mod, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);

        if (mod) {
            /* read hash, find the schema node starting from mod, possibly yang_data_name */
            r = lyb_parse_schema_hash(NULL, mod, data, yang_data_name, options, &snode, lybs);
        }
    } else {
        mod = lyd_node_module(parent);

        /* read hash, find the schema node starting from parent schema */
        r = lyb_parse_schema_hash(parent->schema, NULL, data, NULL, options, &snode, lybs);
    }
    ret += r;
    LYB_HAVE_READ_GOTO(r, data, error);

    if (!mod || !snode) {
        /* unknown data subtree, skip it whole */
        ret += (r = lyb_skip_subtree(data, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);
        goto stop_subtree;
    }

    /*
     * read the node
     */
    node = lyb_new_node(snode);
    if (!node) {
        goto error;
    }

    ret += (r = lyb_parse_attributes(node, data, options, unres, lybs));
    LYB_HAVE_READ_GOTO(r, data, error);

    /* read node content */
    switch (snode->nodetype) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_NOTIF:
    case LYS_RPC:
    case LYS_ACTION:
        /* nothing to read */
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
        ret += (r = lyb_parse_value(&((struct lys_node_leaf *)node->schema)->type, (struct lyd_node_leaf_list *)node,
                                    NULL, data, unres, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        ret += (r = lyb_parse_anydata(node, data, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);
        break;
    default:
        goto error;
    }

    /* insert into data tree, manually */
    if (parent) {
        if (!parent->child) {
            /* only child */
            parent->child = node;
        } else {
            /* last child */
            parent->child->prev->next = node;
            node->prev = parent->child->prev;
            parent->child->prev = node;
        }
        node->parent = parent;
    } else if (*first_sibling) {
        /* last sibling */
        (*first_sibling)->prev->next = node;
        node->prev = (*first_sibling)->prev;
        (*first_sibling)->prev = node;
    } else {
        /* only sibling */
        *first_sibling = node;
    }

    /* read all descendants */
    while (lybs->written[lybs->used - 1]) {
        ret += (r = lyb_parse_subtree(data, node, NULL, NULL, options, unres, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);
    }

    /* make containers default if should be */
    if ((node->schema->nodetype == LYS_CONTAINER) && !((struct lys_node_container *)node->schema)->presence) {
        LY_TREE_FOR(node->child, iter) {
            if (!iter->dflt) {
                break;
            }
        }

        if (!iter) {
            node->dflt = 1;
        }
    }

#ifdef LY_ENABLED_CACHE
    /* calculate the hash and insert it into parent (list with keys is handled when its keys are inserted) */
    if ((node->schema->nodetype != LYS_LIST) || !((struct lys_node_list *)node->schema)->keys_size) {
        lyd_hash(node);
        lyd_insert_hash(node);
    }
#endif

stop_subtree:
    /* end the subtree */
    lyb_read_stop_subtree(lybs);

    return ret;

error:
    lyd_free(node);
    if (first_sibling && (*first_sibling == node)) {
        *first_sibling = NULL;
    }
    return -1;
}